

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldblib.c
# Opt level: O2

int db_getinfo(lua_State *L)

{
  int iVar1;
  lua_State *L1;
  char *pcVar2;
  lua_Integer lVar3;
  char *pcVar4;
  int idx;
  int arg;
  lua_Debug ar;
  
  L1 = getthread(L,&arg);
  pcVar2 = luaL_optlstring(L,arg + 2,"flnStu",(size_t *)0x0);
  checkstack(L,L1,3);
  idx = arg + 1;
  iVar1 = lua_type(L,idx);
  if (iVar1 == 6) {
    pcVar2 = lua_pushfstring(L,">%s",pcVar2);
    lua_pushvalue(L,idx);
    lua_xmove(L,L1,1);
  }
  else {
    lVar3 = luaL_checkinteger(L,idx);
    iVar1 = lua_getstack(L1,(int)lVar3,&ar);
    if (iVar1 == 0) {
      lua_pushnil(L);
      return 1;
    }
  }
  iVar1 = lua_getinfo(L1,pcVar2,&ar);
  if (iVar1 == 0) {
    iVar1 = luaL_argerror(L,arg + 2,"invalid option");
  }
  else {
    lua_createtable(L,0,0);
    pcVar4 = strchr(pcVar2,0x53);
    if (pcVar4 != (char *)0x0) {
      settabss(L,"source",ar.source);
      settabss(L,"short_src",ar.short_src);
      settabsi(L,"linedefined",ar.linedefined);
      settabsi(L,"lastlinedefined",ar.lastlinedefined);
      settabss(L,"what",ar.what);
    }
    pcVar4 = strchr(pcVar2,0x6c);
    if (pcVar4 != (char *)0x0) {
      settabsi(L,"currentline",ar.currentline);
    }
    pcVar4 = strchr(pcVar2,0x75);
    if (pcVar4 != (char *)0x0) {
      settabsi(L,"nups",(uint)ar.nups);
      settabsi(L,"nparams",(uint)ar.nparams);
      settabsb(L,"isvararg",(int)ar.isvararg);
    }
    pcVar4 = strchr(pcVar2,0x6e);
    if (pcVar4 != (char *)0x0) {
      settabss(L,"name",ar.name);
      settabss(L,"namewhat",ar.namewhat);
    }
    pcVar4 = strchr(pcVar2,0x74);
    if (pcVar4 != (char *)0x0) {
      settabsb(L,"istailcall",(int)ar.istailcall);
    }
    pcVar4 = strchr(pcVar2,0x4c);
    if (pcVar4 != (char *)0x0) {
      treatstackoption(L,L1,"activelines");
    }
    pcVar2 = strchr(pcVar2,0x66);
    iVar1 = 1;
    if (pcVar2 != (char *)0x0) {
      treatstackoption(L,L1,"func");
    }
  }
  return iVar1;
}

Assistant:

static int db_getinfo (lua_State *L) {
  lua_Debug ar;
  int arg;
  lua_State *L1 = getthread(L, &arg);
  const char *options = luaL_optstring(L, arg+2, "flnSrtu");
  checkstack(L, L1, 3);
  if (lua_isfunction(L, arg + 1)) {  /* info about a function? */
    options = lua_pushfstring(L, ">%s", options);  /* add '>' to 'options' */
    lua_pushvalue(L, arg + 1);  /* move function to 'L1' stack */
    lua_xmove(L, L1, 1);
  }
  else {  /* stack level */
    if (!lua_getstack(L1, (int)luaL_checkinteger(L, arg + 1), &ar)) {
      luaL_pushfail(L);  /* level out of range */
      return 1;
    }
  }
  if (!lua_getinfo(L1, options, &ar))
    return luaL_argerror(L, arg+2, "invalid option");
  lua_newtable(L);  /* table to collect results */
  if (strchr(options, 'S')) {
    lua_pushlstring(L, ar.source, ar.srclen);
    lua_setfield(L, -2, "source");
    settabss(L, "short_src", ar.short_src);
    settabsi(L, "linedefined", ar.linedefined);
    settabsi(L, "lastlinedefined", ar.lastlinedefined);
    settabss(L, "what", ar.what);
  }
  if (strchr(options, 'l'))
    settabsi(L, "currentline", ar.currentline);
  if (strchr(options, 'u')) {
    settabsi(L, "nups", ar.nups);
    settabsi(L, "nparams", ar.nparams);
    settabsb(L, "isvararg", ar.isvararg);
  }
  if (strchr(options, 'n')) {
    settabss(L, "name", ar.name);
    settabss(L, "namewhat", ar.namewhat);
  }
  if (strchr(options, 'r')) {
    settabsi(L, "ftransfer", ar.ftransfer);
    settabsi(L, "ntransfer", ar.ntransfer);
  }
  if (strchr(options, 't'))
    settabsb(L, "istailcall", ar.istailcall);
  if (strchr(options, 'L'))
    treatstackoption(L, L1, "activelines");
  if (strchr(options, 'f'))
    treatstackoption(L, L1, "func");
  return 1;  /* return table */
}